

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::initRep(SPxSolverBase<double> *this,Representation p_rep)

{
  UpdateVector<double> *pUVar1;
  int iVar2;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  UpdateVector<double> *pUVar7;
  long lVar8;
  UpdateVector<double> *pUVar9;
  UpdateVector<double> *pUVar10;
  
  this->theRep = p_rep;
  pUVar1 = &this->addVec;
  if (p_rep == COLUMN) {
    this->thevectors =
         &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>;
    this->thecovectors = (SVSetBase<double> *)this;
    this->theFrhs = &this->primRhs;
    this->theFvec = &this->primVec;
    this->theCoPrhs = &this->dualRhs;
    pUVar7 = &this->dualVec;
    lVar4 = 0x628;
    lVar5 = 0x610;
    lVar6 = 0x658;
    lVar8 = 0x640;
    pUVar9 = pUVar7;
    pUVar10 = pUVar1;
  }
  else {
    this->thevectors = (SVSetBase<double> *)this;
    this->thecovectors =
         &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>;
    this->theFrhs = &this->dualRhs;
    this->theFvec = &this->dualVec;
    this->theCoPrhs = &this->primRhs;
    pUVar7 = &this->primVec;
    lVar4 = 0x658;
    lVar5 = 0x640;
    lVar6 = 0x628;
    lVar8 = 0x610;
    pUVar9 = pUVar1;
    pUVar10 = pUVar7;
  }
  this->theCoPvec = pUVar7;
  this->thePvec = pUVar1;
  this->theRPvec = pUVar9;
  this->theCPvec = pUVar10;
  this->theUbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar8);
  this->theLbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar6);
  this->theCoUbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar5);
  this->theCoLbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar4);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])(this);
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxBasisBase<double>::reDim(&this->super_SPxBasisBase<double>);
  (this->super_SPxBasisBase<double>).minStab = 0.0;
  pDVar3 = &(this->super_SPxBasisBase<double>).thedesc.rowstat;
  if (((this->super_SPxBasisBase<double>).theLP)->theRep == ROW) {
    (this->super_SPxBasisBase<double>).thedesc.stat = pDVar3;
    pDVar3 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
  }
  else {
    (this->super_SPxBasisBase<double>).thedesc.stat =
         &(this->super_SPxBasisBase<double>).thedesc.colstat;
  }
  (this->super_SPxBasisBase<double>).thedesc.costat = pDVar3;
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    SPxBasisBase<double>::loadDesc
              (&this->super_SPxBasisBase<double>,&(this->super_SPxBasisBase<double>).thedesc);
  }
  if (this->thepricer != (SPxPricer<double> *)0x0) {
    iVar2 = (*this->thepricer->_vptr_SPxPricer[3])();
    if ((SPxSolverBase<double> *)CONCAT44(extraout_var,iVar2) == this) {
      (*this->thepricer->_vptr_SPxPricer[8])(this->thepricer,p_rep);
      return;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::initRep(Representation p_rep)
   {
      theRep = p_rep;

      if(theRep == COLUMN)
      {
         thevectors   = this->colSet();
         thecovectors = this->rowSet();
         theFrhs      = &primRhs;
         theFvec      = &primVec;
         theCoPrhs    = &dualRhs;
         theCoPvec    = &dualVec;
         thePvec      = &addVec;
         theRPvec     = theCoPvec;
         theCPvec     = thePvec;
         theUbound    = &theUCbound;
         theLbound    = &theLCbound;
         theCoUbound  = &theURbound;
         theCoLbound  = &theLRbound;
      }
      else
      {
         assert(theRep == ROW);

         thevectors   = this->rowSet();
         thecovectors = this->colSet();
         theFrhs      = &dualRhs;
         theFvec      = &dualVec;
         theCoPrhs    = &primRhs;
         theCoPvec    = &primVec;
         thePvec      = &addVec;
         theRPvec     = thePvec;
         theCPvec     = theCoPvec;
         theUbound    = &theURbound;
         theLbound    = &theLRbound;
         theCoUbound  = &theUCbound;
         theCoLbound  = &theLCbound;
      }

      unInit();
      reDim();

      forceRecompNonbasicValue();

      SPxBasisBase<R>::setRep();

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::loadDesc(this->desc());

      if(thepricer && thepricer->solver() == this)
         thepricer->setRep(p_rep);
   }